

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edges_iterators.cc
# Opt level: O2

bool __thiscall
tchecker::syncprod::vloc_edges_iterator_t::operator==
          (vloc_edges_iterator_t *this,vloc_edges_iterator_t *it)

{
  bool bVar1;
  
  bVar1 = vloc_synchronized_edges_iterator_t::operator==(&this->_sync_it,&it->_sync_it);
  if (bVar1) {
    bVar1 = join_iterator_t<tchecker::range_t<boost::iterators::transform_iterator<std::function<tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_(unsigned_int)>,_const_unsigned_int_*,_boost::use_default,_boost::use_default>,_boost::iterators::transform_iterator<std::function<tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_(unsigned_int)>,_const_unsigned_int_*,_boost::use_default,_boost::use_default>_>,_tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_>
            ::operator==(&this->_async_it,&it->_async_it);
    return bVar1;
  }
  return false;
}

Assistant:

bool vloc_edges_iterator_t::operator==(tchecker::syncprod::vloc_edges_iterator_t const & it) const
{
  return ((_sync_it == it._sync_it) && (_async_it == it._async_it));
}